

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O0

int decompress_data(j_decompress_ptr cinfo,JSAMPIMAGE output_buf)

{
  int iVar1;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  long in_RSI;
  long in_RDI;
  inverse_DCT_method_ptr inverse_DCT;
  jpeg_component_info *compptr;
  JDIMENSION output_col;
  JSAMPARRAY output_ptr;
  JBLOCKROW buffer_ptr;
  JBLOCKARRAY buffer;
  int block_rows;
  int block_row;
  int ci;
  JDIMENSION block_num;
  JDIMENSION last_iMCU_row;
  my_coef_ptr_conflict coef;
  long local_60;
  long local_50;
  long local_48;
  uint local_34;
  int local_30;
  int local_2c;
  uint local_28;
  
  lVar2 = *(long *)(in_RDI + 0x230);
  iVar1 = *(int *)(in_RDI + 0x1a4);
  while( true ) {
    bVar4 = true;
    if ((*(int *)(in_RDI + 0xb4) <= *(int *)(in_RDI + 0xac)) &&
       (bVar4 = false, *(int *)(in_RDI + 0xac) == *(int *)(in_RDI + 0xb4))) {
      bVar4 = *(uint *)(in_RDI + 0xb0) <= *(uint *)(in_RDI + 0xb8);
    }
    if (!bVar4) break;
    iVar5 = (*(code *)**(undefined8 **)(in_RDI + 0x240))(in_RDI);
    if (iVar5 == 0) {
      return 0;
    }
  }
  local_2c = 0;
  local_60 = *(long *)(in_RDI + 0x130);
  for (; local_2c < *(int *)(in_RDI + 0x38); local_2c = local_2c + 1) {
    if (*(int *)(local_60 + 0x30) != 0) {
      lVar7 = (**(code **)(*(long *)(in_RDI + 8) + 0x40))
                        (in_RDI,*(undefined8 *)(lVar2 + 0x90 + (long)local_2c * 8),
                         *(int *)(in_RDI + 0xb8) * *(int *)(local_60 + 0xc),
                         *(undefined4 *)(local_60 + 0xc),0);
      if (*(uint *)(in_RDI + 0xb8) < iVar1 - 1U) {
        local_34 = *(uint *)(local_60 + 0xc);
      }
      else {
        local_34 = *(uint *)(local_60 + 0x20) % *(uint *)(local_60 + 0xc);
        if (local_34 == 0) {
          local_34 = *(uint *)(local_60 + 0xc);
        }
      }
      pcVar3 = *(code **)(*(long *)(in_RDI + 600) + 8 + (long)local_2c * 8);
      local_50 = *(long *)(in_RSI + (long)local_2c * 8);
      for (local_30 = 0; local_30 < (int)local_34; local_30 = local_30 + 1) {
        local_48 = *(long *)(lVar7 + (long)local_30 * 8) +
                   (ulong)*(uint *)(*(long *)(in_RDI + 0x220) + 0x1c + (long)local_2c * 4) * 0x80;
        for (local_28 = *(uint *)(*(long *)(in_RDI + 0x220) + 0x1c + (long)local_2c * 4);
            local_28 <= *(uint *)(*(long *)(in_RDI + 0x220) + 0x44 + (long)local_2c * 4);
            local_28 = local_28 + 1) {
          (*pcVar3)(in_RDI,local_60,local_48,local_50);
          local_48 = local_48 + 0x80;
        }
        local_50 = local_50 + (long)*(int *)(local_60 + 0x24) * 8;
      }
    }
    local_60 = local_60 + 0x60;
  }
  uVar6 = *(int *)(in_RDI + 0xb8) + 1;
  *(uint *)(in_RDI + 0xb8) = uVar6;
  if (uVar6 < *(uint *)(in_RDI + 0x1a4)) {
    return 3;
  }
  return 4;
}

Assistant:

METHODDEF(int)
decompress_data(j_decompress_ptr cinfo, JSAMPIMAGE output_buf)
{
  my_coef_ptr coef = (my_coef_ptr)cinfo->coef;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  JDIMENSION block_num;
  int ci, block_row, block_rows;
  JBLOCKARRAY buffer;
  JBLOCKROW buffer_ptr;
  JSAMPARRAY output_ptr;
  JDIMENSION output_col;
  jpeg_component_info *compptr;
  inverse_DCT_method_ptr inverse_DCT;

  /* Force some input to be done if we are getting ahead of the input. */
  while (cinfo->input_scan_number < cinfo->output_scan_number ||
         (cinfo->input_scan_number == cinfo->output_scan_number &&
          cinfo->input_iMCU_row <= cinfo->output_iMCU_row)) {
    if ((*cinfo->inputctl->consume_input) (cinfo) == JPEG_SUSPENDED)
      return JPEG_SUSPENDED;
  }

  /* OK, output from the virtual arrays. */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Don't bother to IDCT an uninteresting component. */
    if (!compptr->component_needed)
      continue;
    /* Align the virtual buffer for this component. */
    buffer = (*cinfo->mem->access_virt_barray)
      ((j_common_ptr)cinfo, coef->whole_image[ci],
       cinfo->output_iMCU_row * compptr->v_samp_factor,
       (JDIMENSION)compptr->v_samp_factor, FALSE);
    /* Count non-dummy DCT block rows in this iMCU row. */
    if (cinfo->output_iMCU_row < last_iMCU_row)
      block_rows = compptr->v_samp_factor;
    else {
      /* NB: can't use last_row_height here; it is input-side-dependent! */
      block_rows = (int)(compptr->height_in_blocks % compptr->v_samp_factor);
      if (block_rows == 0) block_rows = compptr->v_samp_factor;
    }
    inverse_DCT = cinfo->idct->inverse_DCT[ci];
    output_ptr = output_buf[ci];
    /* Loop over all DCT blocks to be processed. */
    for (block_row = 0; block_row < block_rows; block_row++) {
      buffer_ptr = buffer[block_row] + cinfo->master->first_MCU_col[ci];
      output_col = 0;
      for (block_num = cinfo->master->first_MCU_col[ci];
           block_num <= cinfo->master->last_MCU_col[ci]; block_num++) {
        (*inverse_DCT) (cinfo, compptr, (JCOEFPTR)buffer_ptr, output_ptr,
                        output_col);
        buffer_ptr++;
        output_col += compptr->_DCT_scaled_size;
      }
      output_ptr += compptr->_DCT_scaled_size;
    }
  }

  if (++(cinfo->output_iMCU_row) < cinfo->total_iMCU_rows)
    return JPEG_ROW_COMPLETED;
  return JPEG_SCAN_COMPLETED;
}